

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::iterate
          (TessCoordComponentInvarianceCase *this)

{
  bool bVar1;
  TessPrimitiveType primitiveType;
  SpacingMode spacingMode;
  int iVar2;
  deUint32 dVar3;
  deUint32 tfPrimTypeGL;
  uint uVar4;
  TestLog *this_00;
  undefined4 extraout_var;
  char *str;
  Functions *gl_00;
  ShaderProgram *this_01;
  const_reference pvVar5;
  const_reference outerLevels;
  RenderContext *renderCtx_00;
  MessageBuilder *pMVar6;
  _anonymous_namespace_ *this_02;
  size_type sVar7;
  float *pfVar8;
  Vector<float,_3> *value;
  Vector<float,_2> *value_00;
  VertexArrayBinding *local_598;
  undefined1 local_4d8 [8];
  string local_4d0;
  MessageBuilder local_4b0;
  int local_330;
  int local_32c;
  int compNdx;
  int numComps;
  Vec3 *vec;
  undefined1 local_318 [4];
  int vtxNdx;
  Result tfResult;
  string local_2f0;
  undefined1 *local_2d0;
  undefined1 local_2c8 [8];
  VertexArrayBinding bindings [1];
  MessageBuilder local_258;
  int local_d4;
  undefined1 local_d0 [4];
  int tessLevelCaseNdx;
  TFHandler tfHandler;
  int local_78;
  int i;
  int maxNumVerticesInDrawCall;
  undefined1 local_60 [4];
  deUint32 programGL;
  vector<float,_std::allocator<float>_> tessLevels;
  int numTessLevelCases;
  Functions *gl;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  TessCoordComponentInvarianceCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gl,(RenderTarget *)CONCAT44(extraout_var,iVar2),0x10,0x10,dVar3);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  tessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x20;
  genTessLevelCases((vector<float,_std::allocator<float>_> *)local_60,0x20);
  this_01 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  dVar3 = glu::ShaderProgram::getProgram(this_01);
  (*gl_00->useProgram)(dVar3);
  setViewport(gl_00,(RandomViewport *)&gl);
  (*gl_00->patchParameteri)(0x8e72,6);
  local_78 = 0;
  for (tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_ = 0;
      (int)tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_ < 0x20;
      tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_ =
           tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_ + 1) {
    primitiveType = this->m_primitiveType;
    spacingMode = this->m_spacing;
    bVar1 = this->m_usePointMode;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_60,
                        (long)(tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_ * 6));
    outerLevels = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_60,
                             (long)(tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_ * 6 + 2));
    iVar2 = referenceVertexCount(primitiveType,spacingMode,(bool)(bVar1 & 1),pvVar5,outerLevels);
    local_78 = de::max<int>(local_78,iVar2);
  }
  renderCtx_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_d0,renderCtx_00,local_78);
  for (local_d4 = 0; local_d4 < 0x20; local_d4 = local_d4 + 1) {
    tcu::TestLog::operator<<(&local_258,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_258,(char (*) [35])"Testing with tessellation levels: ");
    this_02 = (_anonymous_namespace_ *)
              std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_60,(long)(local_d4 * 6));
    pfVar8 = (float *)(ulong)(uint)(local_d4 * 3);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_60,(long)(local_d4 * 6 + 2));
    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)&bindings[0].pointer.data,this_02,pvVar5,pfVar8);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &bindings[0].pointer.data);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&bindings[0].pointer.data);
    tcu::MessageBuilder::~MessageBuilder(&local_258);
    tfResult.varying.
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    local_2d0 = local_2c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"in_v_attr",
               (allocator<char> *)
               ((long)&tfResult.varying.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_60,(long)(local_d4 * 6));
    glu::va::Float((VertexArrayBinding *)local_2c8,&local_2f0,1,6,0,pvVar5);
    tfResult.varying.
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tfResult.varying.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tfPrimTypeGL = outputPrimitiveTypeGL(this->m_primitiveType,(bool)(this->m_usePointMode & 1));
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
              ((Result *)local_318,(TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_d0,
               dVar3,tfPrimTypeGL,1,(VertexArrayBinding *)local_2c8,6);
    vec._4_4_ = 0;
    while( true ) {
      iVar2 = vec._4_4_;
      sVar7 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                        ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                         &tfResult);
      if ((int)sVar7 <= iVar2) break;
      _compNdx = (de *)std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                       operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)&tfResult,(long)vec._4_4_);
      local_32c = 2;
      if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        local_32c = 3;
      }
      for (local_330 = 0; local_330 < local_32c; local_330 = local_330 + 1) {
        pfVar8 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)_compNdx,local_330);
        uVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                          ((ulong)(uint)*pfVar8);
        if ((uVar4 & 1) == 0) {
          tcu::TestLog::operator<<(&local_4b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_4b0,(char (*) [29])"Note: output value at index ");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&vec + 4));
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])0x2b882b1);
          if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
            de::toString<tcu::Vector<float,3>>((string *)(local_4d8 + 8),_compNdx,value);
          }
          else {
            tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_4d8,(int)_compNdx,0);
            de::toString<tcu::Vector<float,2>>((string *)(local_4d8 + 8),(de *)local_4d8,value_00);
          }
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_4d8 + 8));
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)(local_4d8 + 8));
          tcu::MessageBuilder::~MessageBuilder(&local_4b0);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid tessellation coordinate component");
          this_local._4_4_ = STOP;
          bVar1 = true;
          goto LAB_020944d7;
        }
      }
      vec._4_4_ = vec._4_4_ + 1;
    }
    bVar1 = false;
LAB_020944d7:
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::Result::~Result((Result *)local_318);
    local_598 = (VertexArrayBinding *)&bindings[0].pointer.data;
    do {
      local_598 = local_598 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_598);
    } while (local_598 != (VertexArrayBinding *)local_2c8);
    if (bVar1) goto LAB_020945b1;
  }
  bVar1 = false;
LAB_020945b1:
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)local_d0);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_local._4_4_ = STOP;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  return this_local._4_4_;
}

Assistant:

TessCoordComponentInvarianceCase::IterateResult TessCoordComponentInvarianceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				numTessLevelCases	= 32;
	const vector<float>		tessLevels			= genTessLevelCases(numTessLevelCases);
	const deUint32			programGL			= m_program->getProgram();

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		for (int i = 0; i < numTessLevelCases; i++)
			maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &tessLevels[6*i+0], &tessLevels[6*i+2]));

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; tessLevelCaseNdx++)
			{
				log << TestLog::Message << "Testing with tessellation levels: " << tessellationLevelsString(&tessLevels[6*tessLevelCaseNdx+0], &tessLevels[6*tessLevelCaseNdx+2]) << TestLog::EndMessage;

				const glu::VertexArrayBinding bindings[] = { glu::va::Float("in_v_attr", 1, (int)6, 0, &tessLevels[6*tessLevelCaseNdx]) };
				const TFHandler::Result tfResult = tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																					DE_LENGTH_OF_ARRAY(bindings), &bindings[0], 6);

				for (int vtxNdx = 0; vtxNdx < (int)tfResult.varying.size(); vtxNdx++)
				{
					const Vec3&		vec			= tfResult.varying[vtxNdx];
					const int		numComps	= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2;

					for (int compNdx = 0; compNdx < numComps; compNdx++)
					{
						if (!checkTessCoordComponent(vec[compNdx]))
						{
							log << TestLog::Message << "Note: output value at index " << vtxNdx << " is "
													<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? de::toString(vec) : de::toString(vec.swizzle(0,1)))
													<< TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid tessellation coordinate component");
							return STOP;
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}